

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::qubits
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this)

{
  int iVar1;
  iterator __first;
  iterator __last;
  allocator<int> local_1a;
  undefined1 local_19;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *local_18;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this_local;
  vector<int,_std::allocator<int>_> *v;
  
  local_19 = 0;
  iVar1 = this->nbQubits_;
  local_18 = this;
  this_local = (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)
               __return_storage_ptr__;
  std::allocator<int>::allocator(&local_1a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(long)iVar1,&local_1a);
  std::allocator<int>::~allocator(&local_1a);
  __first = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  __last = std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             this->offset_);
  return __return_storage_ptr__;
}

Assistant:

std::vector< int > qubits() const override {
        std::vector< int > v( nbQubits_ ) ;
        std::iota( v.begin() , v.end() , offset_ ) ;
        return v ;
      }